

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

const_buffer
webfront::http::std::experimental::net::v1::buffer(const_buffer *b,size_t max_size_in_bytes)

{
  void *data;
  size_t sVar1;
  ulong in_RSI;
  const_buffer *in_RDI;
  size_t local_30;
  const_buffer local_10;
  
  data = const_buffer::data(in_RDI);
  sVar1 = const_buffer::size(in_RDI);
  local_30 = in_RSI;
  if (sVar1 < in_RSI) {
    local_30 = const_buffer::size(in_RDI);
  }
  const_buffer::const_buffer(&local_10,data,local_30);
  return local_10;
}

Assistant:

inline NET_TS_CONST_BUFFER buffer(const const_buffer& b,
    std::size_t max_size_in_bytes) NET_TS_NOEXCEPT
{
  return NET_TS_CONST_BUFFER(b.data(),
      b.size() < max_size_in_bytes
      ? b.size() : max_size_in_bytes
#if defined(NET_TS_ENABLE_BUFFER_DEBUGGING)
      , b.get_debug_check()
#endif // NET_TS_ENABLE_BUFFER_DEBUGGING
      );
}